

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

ArrayFeatureType_ShapeRange * __thiscall
CoreML::Specification::ArrayFeatureType::mutable_shaperange(ArrayFeatureType *this)

{
  bool bVar1;
  ArrayFeatureType_ShapeRange *this_00;
  ArrayFeatureType *this_local;
  
  bVar1 = has_shaperange(this);
  if (!bVar1) {
    clear_ShapeFlexibility(this);
    set_has_shaperange(this);
    this_00 = (ArrayFeatureType_ShapeRange *)operator_new(0x30);
    ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange(this_00);
    (this->ShapeFlexibility_).shaperange_ = this_00;
  }
  return (ArrayFeatureType_ShapeRange *)(this->ShapeFlexibility_).enumeratedshapes_;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureType_ShapeRange* ArrayFeatureType::mutable_shaperange() {
  if (!has_shaperange()) {
    clear_ShapeFlexibility();
    set_has_shaperange();
    ShapeFlexibility_.shaperange_ = new ::CoreML::Specification::ArrayFeatureType_ShapeRange;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ArrayFeatureType.shapeRange)
  return ShapeFlexibility_.shaperange_;
}